

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_partial_sig_load
              (secp256k1_context *ctx,secp256k1_scalar *s,secp256k1_musig_partial_sig *sig)

{
  int iVar1;
  int overflow;
  undefined8 uStack_8;
  
  uStack_8 = 0;
  do {
    iVar1 = (uint)sig->data[uStack_8] - (uint)secp256k1_musig_partial_sig_magic[uStack_8];
    if (sig->data[uStack_8] != secp256k1_musig_partial_sig_magic[uStack_8]) goto LAB_00113de7;
    uStack_8 = uStack_8 + 1;
  } while (uStack_8 != 4);
  iVar1 = 0;
LAB_00113de7:
  if (iVar1 != 0) {
    secp256k1_musig_partial_sig_load_cold_1();
  }
  else {
    secp256k1_scalar_set_b32(s,sig->data + 4,(int *)((long)&uStack_8 + 4));
  }
  return (uint)(iVar1 == 0);
}

Assistant:

static int secp256k1_musig_partial_sig_load(const secp256k1_context* ctx, secp256k1_scalar *s, const secp256k1_musig_partial_sig* sig) {
    int overflow;

    ARG_CHECK(secp256k1_memcmp_var(&sig->data[0], secp256k1_musig_partial_sig_magic, 4) == 0);
    secp256k1_scalar_set_b32(s, &sig->data[4], &overflow);
    /* Parsed signatures can not overflow */
    VERIFY_CHECK(!overflow);
    return 1;
}